

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfgmr.c
# Opt level: O1

int sfgmr(int n,_func_void_float_float_ptr_float_float_ptr *smatvec,
         _func_void_int_float_ptr_float_ptr *spsolve,float *rhs,float *sol,double tol,int im,
         int *itmax,FILE *fits)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  float *pfVar8;
  void *pvVar9;
  void *pvVar10;
  double dVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  size_t n_00;
  ulong uVar16;
  undefined4 in_register_0000008c;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  int j;
  double dVar20;
  uint uVar21;
  size_t sVar22;
  real rVar23;
  float fVar24;
  float negt;
  int i_1;
  uint local_e4;
  size_t local_e0;
  ulong local_d8;
  ulong local_d0;
  float local_c8;
  real local_c4;
  void *local_c0;
  float *local_b8;
  double local_b0;
  ulong local_a8;
  void *local_a0;
  float *local_98;
  float *local_90;
  double local_88;
  _func_void_float_float_ptr_float_float_ptr *local_80;
  float *local_78;
  uint local_70;
  integer local_6c;
  undefined1 local_68 [16];
  ulong local_58;
  float *local_50;
  ulong local_48;
  long *local_40;
  _func_void_int_float_ptr_float_ptr *local_38;
  
  local_d0 = CONCAT44(in_register_0000008c,im);
  local_a8 = (ulong)(uint)*itmax;
  local_6c = 1;
  sVar22 = (size_t)im;
  local_e4 = n;
  local_98 = rhs;
  local_90 = sol;
  local_88 = tol;
  local_80 = smatvec;
  local_38 = spsolve;
  plVar7 = (long *)superlu_malloc(sVar22 * 8 + 8);
  if (-1 < im) {
    iVar6 = (int)local_d0;
    uVar18 = 0;
    do {
      pfVar8 = floatMalloc((long)(int)local_e4);
      plVar7[uVar18] = (long)pfVar8;
      uVar18 = uVar18 + 1;
    } while (iVar6 + 1 != uVar18);
  }
  local_e0 = sVar22 + 1;
  pvVar9 = superlu_malloc(sVar22 * 8);
  pvVar10 = superlu_malloc(sVar22 * 8);
  uVar18 = local_d0 & 0xffffffff;
  local_58 = uVar18;
  if (0 < (int)local_d0) {
    n_00 = 2;
    do {
      pfVar8 = floatMalloc(n_00);
      *(float **)((long)pvVar10 + n_00 * 8 + -0x10) = pfVar8;
      pfVar8 = floatMalloc((long)(int)local_e4);
      *(float **)((long)pvVar9 + n_00 * 8 + -0x10) = pfVar8;
      lVar14 = n_00 - uVar18;
      n_00 = n_00 + 1;
    } while (lVar14 != 1);
  }
  local_a0 = pvVar9;
  local_50 = floatMalloc(sVar22);
  local_78 = floatMalloc(sVar22);
  local_b8 = floatMalloc(local_e0);
  local_d8 = 0;
  local_48 = 0;
  if (0 < (int)local_d0) {
    local_48 = local_d0 & 0xffffffff;
  }
  local_70 = (int)local_a8 + 10;
  local_c8 = 0.0;
  pfVar19 = local_90;
  pfVar8 = local_98;
  local_c0 = pvVar10;
  local_40 = plVar7;
  do {
    (*local_80)(1.0,pfVar19,0.0,(float *)*plVar7);
    if (0 < (long)(int)local_e4) {
      lVar14 = *plVar7;
      lVar13 = 0;
      do {
        *(float *)(lVar14 + lVar13 * 4) = pfVar8[lVar13] - *(float *)(lVar14 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while ((int)local_e4 != lVar13);
    }
    rVar23 = snrm2_((integer *)&local_e4,(real *)*plVar7,&local_6c);
    local_e0 = CONCAT44(local_e0._4_4_,rVar23);
    if ((fits != (FILE *)0x0) && ((int)local_d8 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",(double)rVar23,0);
      rVar23 = (float)local_e0;
    }
    local_b0 = (double)rVar23;
    rVar23 = snrm2_((integer *)&local_e4,pfVar8,&local_6c);
    if (local_b0 <= (double)rVar23 * local_88) {
      bVar5 = false;
    }
    else {
      if (0 < (long)(int)local_e4) {
        lVar14 = *plVar7;
        lVar13 = 0;
        do {
          *(float *)(lVar14 + lVar13 * 4) =
               *(float *)(lVar14 + lVar13 * 4) * (1.0 / (float)local_e0);
          lVar13 = lVar13 + 1;
        } while ((int)local_e4 != lVar13);
      }
      if ((int)local_d8 == 0) {
        local_c8 = (float)(local_b0 * local_88);
      }
      *local_b8 = (float)local_e0;
      dVar11 = 4.94065645841247e-324;
      uVar16 = 0;
      uVar18 = local_d8;
      do {
        pvVar10 = local_a0;
        local_d8 = uVar18;
        if (uVar16 == local_48) {
          sVar22 = local_48 & 0xffffffff;
          break;
        }
        local_b0 = dVar11;
        if (local_38 == (_func_void_int_float_ptr_float_ptr *)0x0) {
          scopy_((integer *)&local_e4,(real *)plVar7[uVar16],&local_6c,
                 *(real **)((long)local_a0 + uVar16 * 8),&local_6c);
        }
        else {
          (*local_38)(local_e4,*(float **)((long)local_a0 + uVar16 * 8),(float *)plVar7[uVar16]);
        }
        local_d8 = (ulong)((int)local_d8 + 1);
        uVar1 = uVar16 + 1;
        (*local_80)(1.0,*(float **)((long)pvVar10 + uVar16 * 8),0.0,(float *)plVar7[uVar1]);
        rVar23 = snrm2_((integer *)&local_e4,(real *)plVar7[uVar1],&local_6c);
        local_68._0_4_ = rVar23;
        dVar11 = 0.0;
        local_e0 = uVar16;
        do {
          local_c4 = sdot_((integer *)&local_e4,(real *)plVar7[(long)dVar11],&local_6c,
                           (real *)plVar7[uVar1],&local_6c);
          *(real *)(*(long *)((long)local_c0 + local_e0 * 8) + (long)dVar11 * 4) = local_c4;
          local_c4 = -local_c4;
          saxpy_((integer *)&local_e4,&local_c4,(real *)plVar7[(long)dVar11],&local_6c,
                 (real *)plVar7[uVar1],&local_6c);
          dVar11 = (double)((long)dVar11 + 1);
        } while (local_b0 != dVar11);
        rVar23 = snrm2_((integer *)&local_e4,(real *)plVar7[uVar1],&local_6c);
        if (rVar23 < (float)local_68._0_4_ * 0.5) {
          do {
            plVar7 = local_40;
            dVar11 = local_b0;
            local_68._0_4_ = rVar23;
            dVar20 = 0.0;
            do {
              local_c4 = sdot_((integer *)&local_e4,(real *)plVar7[(long)dVar20],&local_6c,
                               (real *)plVar7[uVar1],&local_6c);
              lVar14 = *(long *)((long)local_c0 + local_e0 * 8);
              *(float *)(lVar14 + (long)dVar20 * 4) =
                   *(float *)(lVar14 + (long)dVar20 * 4) + local_c4;
              local_c4 = -local_c4;
              saxpy_((integer *)&local_e4,&local_c4,(real *)plVar7[(long)dVar20],&local_6c,
                     (real *)plVar7[uVar1],&local_6c);
              dVar20 = (double)((long)dVar20 + 1);
            } while (dVar11 != dVar20);
            rVar23 = snrm2_((integer *)&local_e4,(real *)plVar7[uVar1],&local_6c);
          } while (rVar23 < (float)local_68._0_4_ * 0.5);
        }
        plVar7 = local_40;
        pfVar19 = local_50;
        sVar22 = local_e0;
        pfVar8 = *(float **)((long)local_c0 + local_e0 * 8);
        pfVar8[uVar1] = rVar23;
        if (((rVar23 != 0.0) || (NAN(rVar23))) && (0 < (long)(int)local_e4)) {
          lVar14 = local_40[uVar1];
          lVar13 = 0;
          do {
            *(float *)(lVar14 + lVar13 * 4) = *(float *)(lVar14 + lVar13 * 4) * (1.0 / rVar23);
            lVar13 = lVar13 + 1;
          } while ((int)local_e4 != lVar13);
        }
        if (local_e0 != 0) {
          fVar24 = *pfVar8;
          uVar18 = 0;
          do {
            pfVar8[uVar18] = local_50[uVar18] * fVar24 + local_78[uVar18] * pfVar8[uVar18 + 1];
            fVar24 = pfVar8[uVar18 + 1] * local_50[uVar18] - fVar24 * local_78[uVar18];
            pfVar8[uVar18 + 1] = fVar24;
            uVar18 = uVar18 + 1;
          } while (local_e0 != uVar18);
        }
        dVar11 = (double)pfVar8[uVar1] * (double)pfVar8[uVar1] +
                 (double)pfVar8[local_e0] * (double)pfVar8[local_e0];
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        uVar18 = local_d8;
        fVar24 = (float)dVar11;
        if ((fVar24 != 0.0) || (NAN(fVar24))) {
          lVar14 = *(long *)((long)local_c0 + sVar22 * 8);
          pfVar19[sVar22] = *(float *)(lVar14 + sVar22 * 4) / fVar24;
          fVar24 = *(float *)(lVar14 + uVar1 * 4) / fVar24;
        }
        else {
          pfVar19[sVar22] = 1.0;
          fVar24 = 0.0;
        }
        local_78[sVar22] = fVar24;
        fVar3 = local_b8[sVar22];
        local_b8[uVar1] = -fVar24 * fVar3;
        local_b8[sVar22] = fVar3 * pfVar19[sVar22];
        lVar14 = *(long *)((long)local_c0 + sVar22 * 8);
        *(float *)(lVar14 + sVar22 * 4) =
             pfVar19[sVar22] * *(float *)(lVar14 + sVar22 * 4) +
             local_78[sVar22] * *(float *)(lVar14 + uVar1 * 4);
        fVar24 = ABS(local_b8[uVar1]);
        iVar6 = (int)local_d8;
        if (fits != (FILE *)0x0) {
          local_68 = ZEXT416((uint)fVar24);
          fprintf((FILE *)fits,"%8d   %10.2e\n",(double)fVar24,local_d8 & 0xffffffff);
          fVar24 = (float)local_68._0_4_;
        }
        if (fVar24 <= local_c8) break;
        dVar11 = (double)((long)local_b0 + 1);
        uVar16 = uVar1;
      } while (iVar6 < (int)local_a8);
      pfVar19 = local_90;
      pfVar8 = local_98;
      pvVar10 = local_c0;
      iVar15 = (int)sVar22;
      uVar21 = (uint)(iVar15 == (int)local_d0);
      uVar12 = iVar15 - uVar21;
      iVar6 = -uVar21;
      lVar14 = (long)(int)uVar12;
      local_b8[lVar14] =
           local_b8[lVar14] / *(float *)(*(long *)((long)local_c0 + lVar14 * 8) + lVar14 * 4);
      if (0 < (int)uVar12) {
        lVar14 = (sVar22 & 0xffffffff) + ~(ulong)(iVar15 == (int)local_d0);
        uVar18 = 1;
        do {
          lVar17 = uVar12 - uVar18;
          fVar24 = local_b8[lVar17];
          lVar13 = lVar14;
          do {
            lVar2 = lVar13 * 8;
            lVar4 = lVar13 + 1;
            lVar13 = lVar13 + 1;
            fVar24 = fVar24 - *(float *)(*(long *)((long)local_c0 + lVar2 + 8) + lVar17 * 4) *
                              local_b8[lVar4];
          } while (lVar13 < (long)(ulong)uVar12);
          local_b8[lVar17] =
               fVar24 / *(float *)(*(long *)((long)local_c0 + lVar17 * 8) + lVar17 * 4);
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + -1;
        } while (uVar18 != iVar15 + iVar6 + 1);
      }
      if (-1 < (int)uVar12) {
        uVar18 = 0;
        do {
          if (0 < (int)local_e4) {
            fVar24 = local_b8[uVar18];
            lVar14 = *(long *)((long)local_a0 + uVar18 * 8);
            uVar16 = 0;
            do {
              local_90[uVar16] = *(float *)(lVar14 + uVar16 * 4) * fVar24 + local_90[uVar16];
              uVar16 = uVar16 + 1;
            } while (local_e4 != uVar16);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != iVar6 + iVar15 + 1);
      }
      local_e0 = sVar22;
      (*local_80)(1.0,local_90,0.0,(float *)*plVar7);
      if (0 < (long)(int)local_e4) {
        lVar14 = *plVar7;
        lVar13 = 0;
        do {
          *(float *)(lVar14 + lVar13 * 4) = pfVar8[lVar13] - *(float *)(lVar14 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while ((int)local_e4 != lVar13);
      }
      rVar23 = snrm2_((integer *)&local_e4,(real *)*plVar7,&local_6c);
      local_d8 = local_d8 & 0xffffffff;
      if ((double)local_c8 / local_88 <= (double)rVar23) {
        local_d8 = (ulong)local_70;
      }
      bVar5 = (double)rVar23 < (double)local_c8 / local_88 && local_c8 < rVar23;
    }
    if ((!bVar5) || ((int)local_a8 <= (int)local_d8)) {
      if (-1 < (int)local_d0) {
        uVar21 = (int)local_d0 + 1;
        uVar18 = 0;
        do {
          superlu_free((void *)plVar7[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      superlu_free(plVar7);
      pfVar8 = local_50;
      uVar18 = local_58;
      pvVar9 = local_a0;
      if (0 < (int)local_d0) {
        uVar16 = 0;
        do {
          superlu_free(*(void **)((long)pvVar10 + uVar16 * 8));
          superlu_free(*(void **)((long)pvVar9 + uVar16 * 8));
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
      }
      iVar6 = (int)local_d8;
      bVar5 = (int)local_a8 <= iVar6;
      superlu_free(pvVar10);
      superlu_free(pvVar9);
      superlu_free(pfVar8);
      superlu_free(local_78);
      superlu_free(local_b8);
      *itmax = iVar6;
      return (int)bVar5;
    }
  } while( true );
}

Assistant:

int sfgmr(int n,
     void (*smatvec) (float, float[], float, float[]),
     void (*spsolve) (int, float[], float[]),
     float *rhs, float *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    float eps1 = 0.0;
    float **hh, *c, *s, *rs;
    float **vv, **z;
    float zero = 0.0;
    float one = 1.0;

    its = 0;
    vv = (float **)SUPERLU_MALLOC((im + 1) * sizeof(float *));
    for (int i = 0; i <= im; i++) vv[i] = floatMalloc(n);
    z = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    hh = (float **)SUPERLU_MALLOC(im * sizeof(float *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = floatMalloc(i + 2);
	z[i] = floatMalloc(n);
    }
    c = floatMalloc(im);
    s = floatMalloc(im);
    rs = floatMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */
	float beta = snrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * snrm2_(&n, rhs, &i_1)) )
	    break;
	float t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    vv[0][j] = vv[0][j] * t;
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0] = beta;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (spsolve)
		spsolve(n, z[i], vv[i]);
	    else
		scopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    smatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    float t0 = snrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		float negt;
		float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		hh[i][j] = tt;
		negt = -tt;
		saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = snrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    float negt;
		    float tt = sdot_(&n, vv[j], &i_1, vv[i1], &i_1);
		    hh[i][j] += tt;
		    negt = -tt;
		    saxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = snrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1] = t;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
		    vv[i1][k] = vv[i1][k] * t;
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		float tt = hh[i][k1];
		hh[i][k1] = c[k1] * tt + s[k1] * hh[i][k];
		hh[i][k] = -s[k1] * tt + c[k1] * hh[i][k];
	    }

	    float gam = sqrt(pow(hh[i][i], 2) + pow(hh[i][i1], 2));

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
		c[i] = hh[i][i] / gam;
		s[i] = hh[i][i1] / gam;
	    }

	    rs[i1] = -s[i] * rs[i];
	    rs[i] = c[i] * rs[i];

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
	    hh[i][i] = c[i] * hh[i][i] + s[i] * hh[i][i1];
	    beta = fabs(rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	rs[i] = rs[i] / hh[i][i];

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    float tt = rs[k];
	    for (int j = k + 1; j <= i; j++)
		tt = tt - hh[j][k] * rs[j];
	    rs[k] = tt / hh[k][k];
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    float tt = rs[j];
	    for (int k = 0; k < n; k++)
		sol[k] += tt * z[j][k];
	}

	/* calculate the residual and output */
	smatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    vv[0][j] = rhs[j] - vv[0][j];	/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = snrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}